

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::cni_holder<void_(*)(bool),_void_(*)(bool)>::cni_holder
          (cni_holder<void_(*)(bool),_void_(*)(bool)> *this,_func_void_bool **func)

{
  function<void_(bool)> *in_RDI;
  cni_helper<void_(*)(bool),_void_(*)(bool)> *this_00;
  function<void_(bool)> *in_stack_ffffffffffffffc0;
  _func_void_bool *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_003c4748;
  this_00 = (cni_helper<void_(*)(bool),_void_(*)(bool)> *)
            ((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<void(bool)>::function<void(*const&)(bool),void>(in_stack_ffffffffffffffc0,local_30);
  cni_helper<void_(*)(bool),_void_(*)(bool)>::cni_helper(this_00,in_RDI);
  std::function<void_(bool)>::~function((function<void_(bool)> *)0x2e6e56);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}